

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hextile.hpp
# Opt level: O3

void __thiscall gamespace::Match::trigger_map_event(Match *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar4 = (this->_board).super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>._x;
  if (uVar4 != 0) {
    uVar2 = (this->_board).super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>.
            _y;
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        lVar3 = 0;
        uVar4 = 0;
        do {
          uVar1 = BoardTile::marked_value
                            ((BoardTile *)
                             ((long)((((this->_board).
                                       super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>
                                       ._data.
                                       super__Vector_base<gamespace::BoardTile,_std::allocator<gamespace::BoardTile>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_marker_layer).
                                     _M_elems + 0xfffffffffffffffd) + lVar3 + uVar2 * lVar5),3);
          if (uVar1 == 1) {
            BoardTile::destroyUnit
                      ((BoardTile *)
                       ((long)((((this->_board).
                                 super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>
                                 ._data.
                                 super__Vector_base<gamespace::BoardTile,_std::allocator<gamespace::BoardTile>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_marker_layer)._M_elems
                              + 0xfffffffffffffffd) +
                       lVar3 + (this->_board).
                               super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>
                               ._y * lVar5));
          }
          uVar4 = uVar4 + 1;
          uVar2 = (this->_board).
                  super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>._y;
          lVar3 = lVar3 + 0x80;
        } while (uVar4 < uVar2);
        uVar4 = (this->_board).
                super_HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>._x;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x80;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

size_t x() {
            return _x;
        }